

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void __thiscall
kratos::SystemVerilogCodeGen::output_module_def(SystemVerilogCodeGen *this,Generator *generator)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  ostream *poVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  ulong uVar4;
  string_view sVar5;
  shared_ptr<kratos::Stmt> sVar6;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  pointer local_68;
  size_type sStack_60;
  ostream *local_58;
  undefined1 local_50 [32];
  
  if ((this->options_).package_name._M_string_length != 0) {
    puVar1 = &(this->stream_).super_stringstream.field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"`include \"",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->options_).package_name._M_dataplus._M_p,
                        (this->options_).package_name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".svh\"",5);
    puVar2 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    local_50[0] = '\n';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,1);
    puVar2 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    local_50[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"import ",7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->options_).package_name._M_dataplus._M_p,
                        (this->options_).package_name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"::*;",4);
    puVar1 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    local_50[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,1);
  }
  if (generator->debug == true) {
    (generator->super_IRNode).verilog_ln =
         *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  }
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  local_68 = (generator->name)._M_dataplus._M_p;
  sStack_60 = (generator->name)._M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0xb;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_50,(detail *)"module {0} ",format_str,args);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(char *)CONCAT71(local_50._1_7_,local_50[0]),local_50._8_8_);
  if ((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]) != local_50 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),local_50._16_8_ + 1);
  }
  generate_module_package_import(this,generator);
  generate_parameters(this,generator);
  sVar5 = indent(this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar5._M_str,sVar5._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  local_50[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_50,1);
  generate_ports(this,generator);
  sVar5 = indent(this);
  local_58 = (ostream *)puVar1;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar5._M_str,sVar5._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,");",2);
  puVar1 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  local_50[0] = '\n';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_50,1);
  puVar1 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  local_50[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,1);
  generate_enums(this,generator);
  generate_variables(this,generator);
  generate_interface(this,generator);
  generate_functions(this,generator);
  if ((generator->stmts_).
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (generator->stmts_).
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      sVar6 = Generator::get_stmt((Generator *)local_50,(uint32_t)generator);
      (**this->_vptr_SystemVerilogCodeGen)
                (this,CONCAT71(local_50._1_7_,local_50[0]),
                 sVar6.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      if ((pointer)local_50._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(generator->stmts_).
                                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(generator->stmts_).
                                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  local_68 = (generator->name)._M_dataplus._M_p;
  sStack_60 = (generator->name)._M_string_length;
  format_str_00.size_ = 0xd;
  format_str_00.data_ = (char *)0x12;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_50,(detail *)"endmodule   // {0}",format_str_00,args_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_58,(char *)CONCAT71(local_50._1_7_,local_50[0]),local_50._8_8_);
  puVar1 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  local_68 = (pointer)CONCAT71(local_68._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_68,1);
  if ((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]) != local_50 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),local_50._16_8_ + 1);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::output_module_def(Generator* generator) {  // output module definition
    // insert the header definition, if necessary
    if (!options_.package_name.empty()) {
        // two line indent
        stream_ << "`include \"" << options_.package_name << ".svh\"" << stream_.endl()
                << stream_.endl();
        // import everything
        stream_ << "import " << options_.package_name << "::*;" << stream_.endl();
    }
    if (generator->debug) generator->verilog_ln = stream_.line_no();
    stream_ << ::format("module {0} ", generator->name);
    generate_module_package_import(generator);
    generate_parameters(generator);
    stream_ << indent() << "(" << stream_.endl();
    generate_ports(generator);
    stream_ << indent() << ");" << stream_.endl() << stream_.endl();
    generate_enums(generator);
    generate_variables(generator);
    generate_interface(generator);
    generate_functions(generator);

    for (uint64_t i = 0; i < generator->stmts_count(); i++) {
        dispatch_node(generator->get_stmt(i).get());
    }

    stream_ << ::format("endmodule   // {0}", generator->name) << stream_.endl();
}